

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HeartGenerator.h
# Opt level: O2

Variable * __thiscall
soul::HEARTGenerator::createVariableDeclaration
          (HEARTGenerator *this,VariableDeclaration *v,Role role,bool canBeReference)

{
  Module *this_00;
  Variable *pVVar1;
  Expression *e;
  Expression *pEVar2;
  undefined7 in_register_00000009;
  Role local_7c;
  Annotation local_78;
  Identifier local_48;
  Type local_40;
  
  this_00 = this->module;
  local_7c = role;
  if ((int)CONCAT71(in_register_00000009,canBeReference) == 0) {
    AST::VariableDeclaration::getType(&local_40,v);
    Type::removeReferenceIfPresent((Type *)&local_78,&local_40);
  }
  else {
    AST::VariableDeclaration::getType((Type *)&local_78,v);
  }
  local_48 = convertIdentifier(this,(v->name).name);
  pVVar1 = Module::
           allocate<soul::heart::Variable,soul::CodeLocation&,soul::Type,soul::Identifier,soul::heart::Variable::Role&>
                     (this_00,&(v->super_Statement).super_ASTObject.context.location,
                      (Type *)&local_78,&local_48,&local_7c);
  RefCountedPtr<soul::Structure>::~RefCountedPtr
            ((RefCountedPtr<soul::Structure> *)&local_78.dictionary.strings);
  if (!canBeReference) {
    RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_40.structure);
  }
  (v->generatedVariable).object = pVVar1;
  if ((local_7c == state) && ((v->initialValue).object != (Expression *)0x0)) {
    e = pool_ptr<soul::AST::Expression>::operator*(&v->initialValue);
    pEVar2 = evaluateAsConstantExpression(this,e);
    (pVVar1->initialValue).object = pEVar2;
  }
  AST::Annotation::toPlainAnnotation
            (&local_78,&v->annotation,&((this->module->program).pimpl)->stringDictionary);
  Annotation::operator=(&pVVar1->annotation,&local_78);
  Annotation::~Annotation(&local_78);
  return pVVar1;
}

Assistant:

heart::Variable& createVariableDeclaration (AST::VariableDeclaration& v,
                                                heart::Variable::Role role,
                                                bool canBeReference)
    {
        auto& av = module.allocate<heart::Variable> (v.context.location,
                                                     canBeReference ? v.getType() : v.getType().removeReferenceIfPresent(),
                                                     convertIdentifier (v.name), role);
        v.generatedVariable = av;

        if (role == heart::Variable::Role::state && v.initialValue != nullptr)
            av.initialValue = evaluateAsConstantExpression (*v.initialValue);

        av.annotation = v.annotation.toPlainAnnotation (module.program.getStringDictionary());
        return av;
    }